

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

CharacterCounts __thiscall
ON_XMLNode::WriteChildrenToStream
          (ON_XMLNode *this,wchar_t *stream,ON__UINT32 max_chars,bool includeFormatting,
          bool forceLongFormat,bool sortedProperties)

{
  int iVar1;
  uint extraout_var;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ON_XMLNode *pOVar5;
  uint uVar6;
  CharacterCounts CVar7;
  ChildIterator it;
  ChildIterator local_40;
  
  (*this->_vptr_ON_XMLNode[0x2c])(&local_40,this);
  pOVar5 = (local_40._private)->_current;
  uVar4 = 0;
  if (pOVar5 == (ON_XMLNode *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar6 = 0;
    uVar3 = 0;
    do {
      (local_40._private)->_current = pOVar5->_private->m_next_sibling;
      iVar1 = (*pOVar5->_vptr_ON_XMLNode[0x1c])
                        (pOVar5,stream,(ulong)max_chars,(ulong)includeFormatting,forceLongFormat,
                         sortedProperties);
      uVar6 = uVar6 + iVar1;
      uVar3 = uVar3 + extraout_var;
      if (stream != (wchar_t *)0x0) {
        stream = stream + extraout_var;
      }
      max_chars = max_chars - iVar1;
      if ((int)max_chars < 1) {
        max_chars = 0;
      }
      pOVar5 = (local_40._private)->_current;
    } while (pOVar5 != (ON_XMLNode *)0x0);
    uVar4 = (ulong)uVar3 << 0x20;
    uVar2 = (ulong)uVar6;
  }
  ChildIterator::~ChildIterator(&local_40);
  CVar7._reserved = 0;
  CVar7._logical = (int)(uVar4 | uVar2);
  CVar7._physical = (int)((uVar4 | uVar2) >> 0x20);
  return CVar7;
}

Assistant:

ON_XMLNode::CharacterCounts ON_XMLNode::WriteChildrenToStream(wchar_t* stream, ON__UINT32 max_chars, bool includeFormatting, bool forceLongFormat, bool sortedProperties) const
{
  CharacterCounts counts;

  ON_XMLNode* pChild = nullptr;
  auto it = GetChildIterator();
  while (nullptr != (pChild = it.GetNextChild()))
  {
    const auto cc = pChild->WriteToStreamEx(stream, max_chars, includeFormatting, forceLongFormat, sortedProperties);
    counts += cc;
    if (nullptr != stream)
      stream += cc._physical;
    max_chars = std::max(0, int(max_chars - cc._logical));
  }

  return counts;
}